

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_Corruption::_Run(_Test_Corruption *this)

{
  WriteBatch *b;
  WriteBatch batch;
  string local_1c8;
  char *local_1a8;
  char *local_1a0;
  
  WriteBatch::WriteBatch(&batch);
  local_1a8 = "foo";
  local_1a0 = (char *)0x3;
  local_1c8._M_dataplus._M_p = "bar";
  local_1c8._M_string_length = 3;
  WriteBatch::Put(&batch,(Slice *)&local_1a8,(Slice *)&local_1c8);
  local_1a8 = "box";
  local_1a0 = (char *)0x3;
  WriteBatch::Delete(&batch,(Slice *)&local_1a8);
  WriteBatchInternal::SetSequence(&batch,200);
  local_1a0 = (char *)(batch.rep_._M_string_length - 1);
  local_1a8 = batch.rep_._M_dataplus._M_p;
  WriteBatchInternal::SetContents(&batch,(Slice *)&local_1a8);
  test::Tester::Tester
            ((Tester *)&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x59);
  PrintContents_abi_cxx11_(&local_1c8,(leveldb *)&batch,b);
  test::Tester::IsEq<char[30],std::__cxx11::string>
            ((Tester *)&local_1a8,(char (*) [30])"Put(foo, bar)@200ParseError()",&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  test::Tester::~Tester((Tester *)&local_1a8);
  WriteBatch::~WriteBatch(&batch);
  return;
}

Assistant:

TEST(WriteBatchTest, Corruption) {
  WriteBatch batch;
  batch.Put(Slice("foo"), Slice("bar"));
  batch.Delete(Slice("box"));
  WriteBatchInternal::SetSequence(&batch, 200);
  Slice contents = WriteBatchInternal::Contents(&batch);
  WriteBatchInternal::SetContents(&batch,
                                  Slice(contents.data(), contents.size() - 1));
  ASSERT_EQ(
      "Put(foo, bar)@200"
      "ParseError()",
      PrintContents(&batch));
}